

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

size_t OpenMD::DataStorage::getBytesPerStuntDouble(int layout)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  lVar1 = 0x18;
  if ((layout & 1U) == 0) {
    lVar1 = 0;
  }
  uVar3 = (ulong)(((uint)layout >> 6 & 8) + ((uint)layout >> 5 & 8) +
                 ((uint)layout >> 4 & 8) + ((uint)layout >> 3 & 8));
  auVar5._0_4_ = -(uint)((layout & 0x10U) == 0);
  auVar5._4_4_ = -(uint)((layout & 8U) == 0);
  auVar5._8_4_ = -(uint)((layout & 4U) == 0);
  auVar5._12_4_ = -(uint)((layout & 2U) == 0);
  auVar4._0_4_ = -(uint)((layout & 0x1000U) == 0);
  auVar4._4_4_ = -(uint)((layout & 0x800U) == 0);
  auVar4._8_4_ = -(uint)((layout & 0x400U) == 0);
  auVar4._12_4_ = -(uint)((layout & 0x20U) == 0);
  auVar4 = packssdw(auVar4,auVar5);
  auVar4 = packsswb(auVar4,auVar4);
  lVar2 = lVar1 + 0x18;
  if ((auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = lVar1;
  }
  lVar1 = lVar2 + 0x18;
  if ((auVar4 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = lVar2;
  }
  lVar2 = lVar1 + 0x48;
  if ((auVar4 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = lVar1;
  }
  lVar1 = lVar2 + 0x18;
  if ((auVar4 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = lVar2;
  }
  lVar2 = lVar1 + 0x18;
  if ((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = lVar1;
  }
  lVar1 = lVar2 + uVar3 + 0x18;
  if ((auVar4 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = lVar2 + uVar3;
  }
  lVar2 = lVar1 + 0x48;
  if ((auVar4 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = lVar1;
  }
  lVar1 = lVar2 + 0x18;
  if ((auVar4 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = lVar2;
  }
  return (ulong)(((uint)layout >> 0xd & 8) + ((uint)layout >> 0xc & 8) +
                 ((uint)layout >> 0xb & 8) + ((uint)layout >> 10 & 8) + ((uint)layout >> 0xe & 8)) +
         lVar1;
}

Assistant:

std::size_t DataStorage::getBytesPerStuntDouble(int layout) {
    std::size_t bytes = 0;
    if (layout & dslPosition) { bytes += sizeof(Vector3d); }
    if (layout & dslVelocity) { bytes += sizeof(Vector3d); }
    if (layout & dslForce) { bytes += sizeof(Vector3d); }
    if (layout & dslAmat) { bytes += sizeof(RotMat3x3d); }
    if (layout & dslAngularMomentum) { bytes += sizeof(Vector3d); }
    if (layout & dslTorque) { bytes += sizeof(Vector3d); }
    if (layout & dslParticlePot) { bytes += sizeof(RealType); }
    if (layout & dslDensity) { bytes += sizeof(RealType); }
    if (layout & dslFunctional) { bytes += sizeof(RealType); }
    if (layout & dslFunctionalDerivative) { bytes += sizeof(RealType); }
    if (layout & dslDipole) { bytes += sizeof(Vector3d); }
    if (layout & dslQuadrupole) { bytes += sizeof(Mat3x3d); }
    if (layout & dslElectricField) { bytes += sizeof(Vector3d); }
    if (layout & dslSkippedCharge) { bytes += sizeof(RealType); }
    if (layout & dslFlucQPosition) { bytes += sizeof(RealType); }
    if (layout & dslFlucQVelocity) { bytes += sizeof(RealType); }
    if (layout & dslFlucQForce) { bytes += sizeof(RealType); }
    if (layout & dslSitePotential) { bytes += sizeof(RealType); }

    return bytes;
  }